

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O0

void __thiscall cashew::JSPrinter::JSPrinter(JSPrinter *this,bool pretty_,bool finalize_,Ref ast_)

{
  bool finalize__local;
  bool pretty__local;
  JSPrinter *this_local;
  Ref ast__local;
  
  this->pretty = pretty_;
  this->finalize = finalize_;
  this->buffer = (char *)0x0;
  this->size = 0;
  this->used = 0;
  this->indent = 0;
  this->possibleSpace = false;
  (this->ast).inst = ast_.inst;
  return;
}

Assistant:

JSPrinter(bool pretty_, bool finalize_, Ref ast_)
    : pretty(pretty_), finalize(finalize_), ast(ast_) {}